

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

void C_ClearAliases(void)

{
  FConsoleCommand *pFVar1;
  uint uVar2;
  FConsoleCommand *next;
  FConsoleCommand *alias;
  int bucket;
  
  for (alias._4_4_ = 0; alias._4_4_ < 0xfb; alias._4_4_ = alias._4_4_ + 1) {
    pFVar1 = Commands[alias._4_4_];
    while (next = pFVar1, next != (FConsoleCommand *)0x0) {
      pFVar1 = next->m_Next;
      uVar2 = (*next->_vptr_FConsoleCommand[2])();
      if ((uVar2 & 1) != 0) {
        FConsoleAlias::SafeDelete((FConsoleAlias *)next);
      }
    }
  }
  return;
}

Assistant:

void C_ClearAliases ()
{
	int bucket;
	FConsoleCommand *alias;

	for (bucket = 0; bucket < FConsoleCommand::HASH_SIZE; bucket++)
	{
		alias = Commands[bucket];
		while (alias)
		{
			FConsoleCommand *next = alias->m_Next;
			if (alias->IsAlias())
				static_cast<FConsoleAlias *>(alias)->SafeDelete();
			alias = next;
		}
	}
}